

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void Eigen::internal::manage_caching_sizes(Action action,ptrdiff_t *l1,ptrdiff_t *l2)

{
  int iVar1;
  ptrdiff_t *l2_local;
  ptrdiff_t *l1_local;
  Action action_local;
  
  if (manage_caching_sizes::m_l2CacheSize == 0) {
    iVar1 = queryL1CacheSize();
    manage_caching_sizes::m_l1CacheSize = manage_caching_sizes_helper((long)iVar1,0x2000);
    iVar1 = queryTopLevelCacheSize();
    manage_caching_sizes::m_l2CacheSize = manage_caching_sizes_helper((long)iVar1,0x100000);
  }
  if (action == SetAction) {
    manage_caching_sizes::m_l1CacheSize = *l1;
    manage_caching_sizes::m_l2CacheSize = *l2;
  }
  else if (action == GetAction) {
    *l1 = manage_caching_sizes::m_l1CacheSize;
    *l2 = manage_caching_sizes::m_l2CacheSize;
  }
  return;
}

Assistant:

inline void manage_caching_sizes(Action action, std::ptrdiff_t* l1=0, std::ptrdiff_t* l2=0)
{
  static std::ptrdiff_t m_l1CacheSize = 0;
  static std::ptrdiff_t m_l2CacheSize = 0;
  if(m_l2CacheSize==0)
  {
    m_l1CacheSize = manage_caching_sizes_helper(queryL1CacheSize(),8 * 1024);
    m_l2CacheSize = manage_caching_sizes_helper(queryTopLevelCacheSize(),1*1024*1024);
  }
  
  if(action==SetAction)
  {
    // set the cpu cache size and cache all block sizes from a global cache size in byte
    eigen_internal_assert(l1!=0 && l2!=0);
    m_l1CacheSize = *l1;
    m_l2CacheSize = *l2;
  }
  else if(action==GetAction)
  {
    eigen_internal_assert(l1!=0 && l2!=0);
    *l1 = m_l1CacheSize;
    *l2 = m_l2CacheSize;
  }
  else
  {
    eigen_internal_assert(false);
  }
}